

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pfx.c
# Opt level: O1

void create_ip4_pfx_record
               (pfx_record *pfx,uint32_t asn,char *ip,uint8_t min_mask_len,uint8_t max_mask_len)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pfx->asn = asn;
  pfx->min_len = min_mask_len;
  pfx->max_len = max_mask_len;
  pfx->socket = (rtr_socket *)0x1;
  iVar2 = lrtr_ip_str_to_addr(ip,&pfx->prefix);
  if (iVar2 != 0) {
    __assert_fail("!lrtr_ip_str_to_addr(ip, &pfx->prefix)",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_pfx.c"
                  ,0x14f,
                  "void create_ip4_pfx_record(struct pfx_record *, uint32_t, const char *, uint8_t, uint8_t)"
                 );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void create_ip4_pfx_record(struct pfx_record *pfx, uint32_t asn, const char *ip, uint8_t min_mask_len,
				  uint8_t max_mask_len)
{
	pfx->asn = asn;
	pfx->min_len = min_mask_len;
	pfx->max_len = max_mask_len;
	pfx->socket = (struct rtr_socket *)1;
	assert(!lrtr_ip_str_to_addr(ip, &pfx->prefix));
}